

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

HighsInt __thiscall HFactor::buildKernel(HFactor *this)

{
  pointer *ppcVar1;
  int iVar2;
  iterator iVar3;
  iterator __position;
  iterator iVar4;
  pointer pcVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  int iVar10;
  long lVar11;
  size_t sVar12;
  pointer piVar13;
  int iVar14;
  long lVar15;
  int *piVar16;
  double *__args;
  int iVar17;
  long lVar18;
  pointer piVar19;
  int *piVar20;
  HighsInt i;
  int iVar21;
  int iVar22;
  long lVar23;
  pointer piVar24;
  pointer pdVar25;
  bool bVar26;
  uint uVar27;
  ulong uVar28;
  pointer pdVar29;
  HFactor *pHVar30;
  ulong uVar31;
  int iVar32;
  pointer pdVar33;
  bool bVar34;
  bool bVar35;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar36;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar37;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  HighsInt iRowPivot;
  HighsInt iRow;
  double value;
  double pivot_multiplier;
  int local_1a4;
  HFactor *local_1a0;
  double local_198;
  int local_18c;
  pointer local_188;
  double local_180;
  pointer local_178;
  HighsInt local_170;
  int local_16c;
  pointer local_168;
  double local_160;
  int local_154;
  double local_150;
  double local_148;
  pointer local_140;
  pointer local_138;
  long local_130;
  long local_128;
  vector<double,_std::allocator<double>_> *local_120;
  vector<int,_std::allocator<int>_> *local_118;
  pointer local_110;
  pointer local_108;
  ulong local_100;
  pointer local_f8;
  ulong local_f0;
  double local_e8;
  int local_dc;
  undefined1 local_d8 [16];
  double local_c8;
  double local_c0;
  HighsLogOptions *local_b8;
  ulong local_b0;
  long local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  vector<double,std::allocator<double>> *local_90;
  vector<int,std::allocator<int>> *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  vector<signed_char,std::allocator<signed_char>> *local_78;
  vector<int,std::allocator<int>> *local_70;
  vector<int,std::allocator<int>> *local_68;
  long local_60;
  double local_58;
  vector<double,std::allocator<double>> *local_50;
  vector<int,std::allocator<int>> *local_48;
  vector<double,std::allocator<double>> *local_40;
  vector<int,std::allocator<int>> *local_38;
  
  local_58 = this->time_limit_;
  iVar17 = this->nwork;
  iVar10 = iVar17 + -1;
  this->nwork = iVar10;
  if (iVar17 < 1) {
    local_180 = 0.0;
    local_150 = 0.0;
    dVar41 = 0.0;
  }
  else {
    local_a0 = &this->mr_index;
    local_68 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_row;
    local_70 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_var;
    local_78 = (vector<signed_char,std::allocator<signed_char>> *)&(this->refactor_info_).pivot_type
    ;
    local_38 = (vector<int,std::allocator<int>> *)&this->l_index;
    local_40 = (vector<double,std::allocator<double>> *)&this->l_value;
    local_80 = &this->l_start;
    local_48 = (vector<int,std::allocator<int>> *)&this->u_index;
    local_50 = (vector<double,std::allocator<double>> *)&this->u_value;
    local_88 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
    local_90 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
    local_98 = &this->u_start;
    local_118 = &this->mc_index;
    local_120 = &this->mc_value;
    local_b8 = &this->log_options;
    dVar41 = 0.0;
    local_150 = 0.0;
    local_180 = 0.0;
    local_c8 = 0.0;
    local_c0 = 0.0;
    sVar12 = 100;
    local_b0 = 100;
    local_16c = 0;
    local_1a0 = this;
    do {
      local_198 = dVar41;
      if (iVar10 == -0xb) {
        reportAsm(this);
        this = local_1a0;
      }
      pHVar30 = this;
      if (local_58 != INFINITY) {
        iVar10 = (int)local_b0;
        if ((int)((long)local_16c % (long)iVar10) == 0) {
          HighsTimer::read(this->build_timer_,0,
                           (void *)((long)local_16c % (long)iVar10 & 0xffffffff),sVar12);
          local_c8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) - local_c8;
          dVar41 = local_1a0->time_limit_;
          if (dVar41 / 1000.0 < local_c8) {
            uVar27 = iVar10 / 10;
            if (iVar10 / 10 < 2) {
              uVar27 = 1;
            }
            local_b0 = (ulong)uVar27;
          }
          local_c0 = local_c0 * 0.9 + (local_c8 / (double)iVar10) * 0.1;
          if ((dVar41 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
               (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != dVar41) ||
             (dVar41 < (double)((local_1a0->kernel_dim - local_16c) + 1) * local_c0 +
                       (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da))) {
            bVar35 = false;
            local_170 = -1;
          }
          else {
            bVar35 = true;
          }
          local_c8 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          pHVar30 = local_1a0;
          if (!bVar35) {
            return local_170;
          }
        }
      }
      this = local_1a0;
      local_1a4 = -1;
      iVar10 = pHVar30->nwork;
      iVar17 = 8;
      if (iVar10 < 8) {
        iVar17 = iVar10;
      }
      local_130 = CONCAT44(local_130._4_4_,iVar17);
      local_108 = (pHVar30->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      uVar31 = (ulong)local_108[1];
      bVar35 = uVar31 == 0xffffffffffffffff;
      if (bVar35) {
        uVar31 = 0xffffffff;
      }
      else {
        local_1a4 = (pHVar30->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(pHVar30->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar31]];
      }
      bVar26 = !bVar35;
      bVar35 = !bVar35;
      local_128 = CONCAT44(local_128._4_4_,iVar10);
      if (!bVar35) {
        iVar21 = (pHVar30->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
        if ((long)iVar21 != -1) {
          uVar31 = (ulong)(uint)(pHVar30->mr_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [(pHVar30->mr_start).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar21]];
          bVar26 = true;
          bVar35 = true;
          local_1a4 = iVar21;
        }
      }
      iVar32 = (int)uVar31;
      iVar21 = pHVar30->num_basic;
      local_148 = (double)(long)iVar21;
      iVar2 = pHVar30->num_row;
      local_d8._0_8_ = (long)iVar2;
      if ((!bVar35) && (1 < (&pHVar30->num_row)[(ulong)(iVar2 < iVar21) * 2])) {
        dVar41 = (double)iVar2 * (double)iVar21;
        local_168 = (pHVar30->mc_min_pivot).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_178 = (pHVar30->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        piVar24 = (pHVar30->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar33 = (pHVar30->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar13 = (pHVar30->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_188 = (pHVar30->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_138 = (pHVar30->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_110 = (pHVar30->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_f8 = (pHVar30->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_140 = (pHVar30->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_100 = (ulong)(uint)(&pHVar30->num_row)[(ulong)(iVar2 < iVar21) * 2];
        iVar21 = 0;
        uVar28 = 2;
        dVar39 = dVar41;
        do {
          iVar32 = (int)uVar28;
          if (((long)uVar28 <= (long)iVar2) && (uVar27 = local_108[uVar28], uVar27 != 0xffffffff)) {
            iVar14 = iVar21;
            do {
              lVar18 = (long)piVar24[(int)uVar27];
              if (0 < lVar18) {
                lVar23 = (long)local_178[(int)uVar27];
                lVar18 = lVar18 + lVar23;
                do {
                  if (local_168[(int)uVar27] <= ABS(pdVar33[lVar23])) {
                    iVar21 = piVar13[lVar23];
                    dVar38 = (double)(local_188[iVar21] + -1) * (double)(iVar32 + -1);
                    if (dVar38 < dVar39) {
                      bVar26 = (bool)((long)local_188[iVar21] < (long)uVar28 | bVar35);
                      uVar31 = (ulong)uVar27;
                      dVar39 = dVar38;
                      local_1a4 = iVar21;
                      bVar35 = bVar26;
                    }
                  }
                  lVar23 = lVar23 + 1;
                } while (lVar23 < lVar18);
              }
              iVar21 = iVar14 + 1;
              bVar35 = bVar26;
              if (dVar39 < dVar41) {
                bVar35 = true;
              }
              if (iVar14 < iVar17) {
                bVar35 = bVar26;
              }
              bVar26 = bVar35;
              if (bVar35) break;
              local_198 = local_198 + (double)iVar32;
              uVar27 = local_138[(int)uVar27];
              iVar14 = iVar21;
            } while (uVar27 != 0xffffffff);
          }
          if ((long)uVar28 <= (long)local_148) {
            iVar14 = local_110[uVar28];
            if (iVar14 != -1) {
              iVar22 = iVar21;
              bVar26 = bVar35;
              do {
                local_f0 = (ulong)iVar14;
                bVar35 = bVar26;
                if (0 < (long)local_188[local_f0]) {
                  lVar23 = (long)local_f8[local_f0];
                  lVar18 = local_188[local_f0] + lVar23;
                  uVar31 = uVar31 & 0xffffffff;
                  do {
                    uVar27 = (pHVar30->mr_index).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar23];
                    iVar21 = piVar24[(int)uVar27];
                    dVar38 = (double)(iVar21 + -1) * (double)(iVar32 + -1);
                    if (dVar38 < dVar39) {
                      lVar15 = (long)local_178[(int)uVar27] << 2;
                      do {
                        lVar11 = lVar15 + 4;
                        piVar16 = (int *)((long)piVar13 + lVar15);
                        lVar15 = lVar11;
                      } while (*piVar16 != iVar14);
                      if (local_168[(int)uVar27] <=
                          ABS(*(double *)((long)pdVar33 + lVar11 * 2 + -8))) {
                        bVar26 = (bool)((long)iVar21 <= (long)uVar28 | bVar26);
                        uVar31 = (ulong)uVar27;
                        dVar39 = dVar38;
                        local_1a4 = iVar14;
                      }
                    }
                    lVar23 = lVar23 + 1;
                    bVar35 = bVar26;
                  } while (lVar23 < lVar18);
                }
                iVar21 = iVar22 + 1;
                bVar26 = bVar35;
                if (dVar39 < dVar41) {
                  bVar26 = true;
                }
                if (iVar22 < iVar17) {
                  bVar26 = bVar35;
                }
                bVar35 = bVar26;
              } while ((!bVar26) && (iVar14 = local_140[local_f0], iVar22 = iVar21, iVar14 != -1));
            }
            local_198 = local_198 + (double)iVar32;
          }
          iVar32 = (int)uVar31;
        } while ((!bVar35) && (bVar34 = uVar28 < local_100, uVar28 = uVar28 + 1, bVar34));
      }
      if (local_1a4 < 0) {
        local_1a0->rank_deficiency = iVar10 + 1;
        highsLogDev(local_b8,kWarning,"Factorization identifies rank deficiency of %d\n");
        local_170 = this->rank_deficiency;
        bVar35 = true;
        dVar41 = local_198;
      }
      else {
        local_e8 = colDelete(local_1a0,iVar32,local_1a4);
        lVar15 = (long)local_1a4;
        piVar24 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar18 = (long)(this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar15];
        lVar23 = (long)piVar24[lVar15] + -1;
        piVar24[lVar15] = (int)lVar23;
        piVar24 = (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar16 = piVar24 + lVar18;
        do {
          piVar20 = piVar16;
          piVar16 = piVar20 + 1;
        } while (*piVar20 != iVar32);
        *piVar20 = piVar24[lVar23 + lVar18];
        piVar24 = (this->col_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar10 = piVar24[iVar32];
        lVar18 = (long)iVar10;
        piVar13 = (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar17 = piVar13[iVar32];
        piVar16 = piVar13 + lVar18;
        if (lVar18 < 0) {
          piVar16 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + (-2 - lVar18);
        }
        *piVar16 = iVar17;
        if (-1 < (long)iVar17) {
          piVar24[iVar17] = iVar10;
        }
        piVar24 = (this->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar10 = piVar24[local_1a4];
        lVar18 = (long)iVar10;
        piVar13 = (this->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar17 = piVar13[local_1a4];
        piVar16 = piVar13 + lVar18;
        if (lVar18 < 0) {
          piVar16 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + (-2 - lVar18);
        }
        *piVar16 = iVar17;
        if (-1 < (long)iVar17) {
          piVar24[iVar17] = iVar10;
        }
        if (this->pivot_tolerance <= ABS(local_e8)) {
          (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar32] = local_1a4;
          iVar3._M_current =
               (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_68,iVar3,&local_1a4);
            this = local_1a0;
          }
          else {
            *iVar3._M_current = local_1a4;
            (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          iVar3._M_current =
               (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_70,iVar3,this->basic_index + iVar32);
            this = local_1a0;
          }
          else {
            *iVar3._M_current = this->basic_index[iVar32];
            (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          __position._M_current =
               (this->refactor_info_).pivot_type.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->refactor_info_).pivot_type.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<signed_char,std::allocator<signed_char>>::
            _M_realloc_insert<signed_char_const&>(local_78,__position,"\x04buildRankDeficiency0:");
            this = local_1a0;
          }
          else {
            *__position._M_current = '\x04';
            ppcVar1 = &(this->refactor_info_).pivot_type.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          lVar18 = (long)(this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar32];
          local_60 = (long)(this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar32];
          local_140 = (pointer)(local_60 + lVar18);
          dVar41 = local_198;
          local_a8 = lVar18;
          if (local_60 < 1) {
            piVar24 = (pointer)0x0;
          }
          else {
            piVar24 = (pointer)0x0;
            do {
              local_18c = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18];
              local_160 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar18] / local_e8;
              (this->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(long)piVar24] = local_18c;
              (this->mwz_column_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_18c] = local_160;
              (this->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[local_18c] = '\x01';
              iVar3._M_current =
                   (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_38,iVar3,&local_18c);
                this = local_1a0;
                dVar41 = local_198;
              }
              else {
                *iVar3._M_current = local_18c;
                (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              iVar4._M_current =
                   (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_40,iVar4,&local_160);
                this = local_1a0;
                dVar41 = local_198;
              }
              else {
                *iVar4._M_current = local_160;
                (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              piVar24 = (pointer)((long)piVar24 + 1);
              piVar13 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_18c] = piVar13[local_18c];
              lVar15 = (long)local_18c;
              lVar23 = (long)(this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar15];
              iVar10 = piVar13[lVar15];
              piVar13[lVar15] = (int)((long)iVar10 + -1);
              piVar13 = (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar16 = piVar13 + lVar23;
              do {
                piVar20 = piVar16;
                piVar16 = piVar20 + 1;
              } while (*piVar20 != iVar32);
              *piVar20 = piVar13[(long)iVar10 + -1 + lVar23];
              lVar18 = lVar18 + 1;
            } while (lVar18 < (long)local_140);
          }
          iVar10 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2);
          local_160 = (double)CONCAT44(local_160._4_4_,iVar10);
          iVar3._M_current =
               (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_80,iVar3,(int *)&local_160);
            this = local_1a0;
            dVar41 = local_198;
          }
          else {
            *iVar3._M_current = iVar10;
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          local_dc = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar32];
          local_154 = (this->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar32];
          if (0 < local_154) {
            iVar10 = (this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar32] + (int)local_a8;
            lVar15 = (long)(iVar10 - local_154);
            lVar18 = lVar15 * 4;
            lVar23 = lVar15 * 8;
            do {
              piVar16 = (int *)((long)(this->mc_index).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar18);
              iVar3._M_current =
                   (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_48,iVar3,piVar16);
                this = local_1a0;
                dVar41 = local_198;
              }
              else {
                *iVar3._M_current = *piVar16;
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              __args = (double *)
                       ((long)(this->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar23);
              iVar4._M_current =
                   (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          (local_50,iVar4,__args);
                this = local_1a0;
                dVar41 = local_198;
              }
              else {
                *iVar4._M_current = *__args;
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              lVar15 = lVar15 + 1;
              lVar18 = lVar18 + 4;
              lVar23 = lVar23 + 8;
            } while (lVar15 < iVar10);
          }
          iVar3._M_current =
               (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_88,iVar3,&local_1a4);
            this = local_1a0;
            dVar41 = local_198;
          }
          else {
            *iVar3._M_current = local_1a4;
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          iVar4._M_current =
               (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_90,iVar4,&local_e8);
            this = local_1a0;
            dVar41 = local_198;
          }
          else {
            *iVar4._M_current = local_e8;
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          iVar10 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2);
          local_160 = (double)CONCAT44(local_160._4_4_,iVar10);
          iVar3._M_current =
               (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          uVar36 = SUB84(local_180,0);
          uVar37 = (undefined4)((ulong)local_180 >> 0x20);
          if (iVar3._M_current ==
              (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_98,iVar3,(int *)&local_160);
            uVar36 = SUB84(local_180,0);
            uVar37 = (undefined4)((ulong)local_180 >> 0x20);
            this = local_1a0;
            dVar41 = local_198;
          }
          else {
            *iVar3._M_current = iVar10;
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          dVar39 = (double)CONCAT44(uVar37,uVar36);
          lVar18 = (long)(this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_1a4];
          pdVar33 = (pointer)((ulong)piVar24 & 0xffffffff);
          if (0 < lVar18) {
            lVar23 = (long)(this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[local_1a4];
            local_f8 = (pointer)(lVar18 + lVar23);
            local_148 = (double)(int)piVar24;
            local_168 = pdVar33;
            local_138 = piVar24;
            do {
              iVar10 = (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23];
              piVar19 = (pointer)(long)iVar10;
              uVar27 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar19];
              local_f0 = (ulong)uVar27;
              iVar17 = (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar19];
              lVar18 = (long)iVar17;
              iVar32 = (uVar27 - 1) + iVar17;
              local_130 = lVar23;
              dVar41 = colDelete(this,iVar10,local_1a4);
              iVar21 = (local_1a0->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar19];
              piVar13 = (local_1a0->mc_count_n).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              iVar2 = (local_1a0->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)piVar19];
              uVar27 = piVar13[(long)piVar19];
              piVar13[(long)piVar19] = uVar27 + 1;
              iVar21 = ~uVar27 + iVar21 + iVar2;
              (local_1a0->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar21] = local_1a4;
              (local_1a0->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar21] = dVar41;
              iVar21 = 0;
              bVar35 = false;
              local_178 = (pointer)((ulong)piVar24 & 0xffffffff);
              if (iVar17 < iVar32) {
                local_178 = (pointer)((ulong)piVar24 & 0xffffffff);
                lVar23 = lVar18;
                do {
                  pcVar5 = (local_1a0->mwz_column_mark).
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar2 = (local_1a0->mc_index).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar23];
                  if (pcVar5[iVar2] != '\0') {
                    dVar39 = (local_1a0->mc_value).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar23];
                    pcVar5[iVar2] = '\0';
                    dVar39 = (local_1a0->mwz_column_array).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2] * -dVar41 + dVar39;
                    dVar40 = ABS(dVar39);
                    dVar38 = 0.0;
                    if (1e-14 <= dVar40) {
                      dVar38 = dVar39;
                    }
                    local_178 = (pointer)(ulong)((int)local_178 - 1);
                    iVar21 = iVar21 + (uint)(dVar40 < 1e-14);
                    (local_1a0->mc_value).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar23] = dVar38;
                  }
                  lVar23 = lVar23 + 1;
                } while (iVar32 != lVar23);
                bVar35 = 0 < iVar21;
              }
              if (bVar35) {
                iVar21 = iVar17;
                if (iVar17 < iVar32) {
                  piVar24 = (local_1a0->mc_index).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pdVar33 = (local_1a0->mc_value).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar13 = (local_1a0->mr_start).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  piVar6 = (local_1a0->mr_count).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  piVar7 = (local_1a0->mr_index).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  do {
                    dVar39 = pdVar33[lVar18];
                    iVar2 = piVar24[lVar18];
                    if ((dVar39 != 0.0) || (NAN(dVar39))) {
                      piVar24[iVar21] = iVar2;
                      pdVar33[iVar21] = dVar39;
                      iVar21 = iVar21 + 1;
                    }
                    else {
                      lVar23 = (long)piVar13[iVar2];
                      lVar15 = (long)piVar6[iVar2] + -1;
                      piVar6[iVar2] = (int)lVar15;
                      piVar16 = piVar7 + lVar23;
                      do {
                        piVar20 = piVar16;
                        piVar16 = piVar20 + 1;
                      } while (*piVar20 != iVar10);
                      *piVar20 = piVar7[lVar15 + lVar23];
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != iVar32);
                }
                (local_1a0->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar19] = iVar21 - iVar17;
              }
              iVar17 = (int)local_178;
              pHVar30 = local_1a0;
              pdVar33 = local_168;
              local_188 = piVar19;
              if (iVar17 < 1) {
LAB_00372c42:
                if ((int)local_138 != 0) {
                  pdVar25 = (pointer)0x0;
                  do {
                    (pHVar30->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(pHVar30->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pdVar25]] = '\x01';
                    pdVar25 = (pointer)((long)pdVar25 + 1);
                  } while (pdVar33 != pdVar25);
                }
              }
              else {
                piVar24 = (local_1a0->mc_count_n).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                iVar21 = (local_1a0->mc_count_a).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)piVar19];
                iVar2 = piVar24[(long)piVar19];
                piVar13 = (local_1a0->mc_space).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                iVar32 = piVar13[(long)piVar19];
                uVar36 = SUB84(dVar41,0);
                uVar37 = (int)((ulong)dVar41 >> 0x20);
                if (iVar32 < iVar21 + iVar17 + iVar2) {
                  local_100 = CONCAT44(local_100._4_4_,iVar2);
                  local_d8._8_4_ = extraout_XMM0_Dc;
                  local_d8._0_8_ = dVar41;
                  local_d8._12_4_ = extraout_XMM0_Dd;
                  piVar6 = (local_1a0->mc_start).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  iVar2 = piVar6[(long)piVar19];
                  lVar18 = (long)iVar2;
                  local_108 = (pointer)CONCAT44(local_108._4_4_,iVar2);
                  if (iVar17 < iVar32) {
                    iVar17 = iVar32;
                  }
                  piVar13[(long)piVar19] = iVar17 + iVar32;
                  iVar17 = (int)((ulong)((long)(local_1a0->mc_index).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)(local_1a0->mc_index).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2);
                  piVar6[(long)piVar19] = iVar17;
                  lVar23 = (long)iVar17;
                  local_110 = (pointer)(piVar13[(long)piVar19] + lVar23);
                  local_128 = (long)piVar24[(long)piVar19];
                  std::vector<int,_std::allocator<int>_>::resize(local_118,(size_type)local_110);
                  std::vector<double,_std::allocator<double>_>::resize
                            (local_120,
                             (local_1a0->mc_space).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[(long)piVar19] + lVar23);
                  lVar15 = (long)(iVar21 + iVar2);
                  sVar12 = lVar15 * 4 + lVar18 * -4;
                  if (sVar12 != 0) {
                    piVar24 = (local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start;
                    memmove(piVar24 + lVar23,piVar24 + lVar18,sVar12);
                  }
                  sVar12 = lVar15 * 8 + lVar18 * -8;
                  if (sVar12 != 0) {
                    pdVar33 = (local_120->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    memmove(pdVar33 + lVar23,pdVar33 + lVar18,sVar12);
                  }
                  iVar32 = iVar32 + (int)local_108;
                  lVar18 = (int)local_110 - local_128;
                  lVar23 = (long)(iVar32 - (int)local_100);
                  sVar12 = (long)iVar32 * 4 + lVar23 * -4;
                  if (sVar12 != 0) {
                    piVar24 = (local_118->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start;
                    memmove(piVar24 + lVar18,piVar24 + lVar23,sVar12);
                  }
                  sVar12 = (long)iVar32 * 8 + lVar23 * -8;
                  uVar36 = local_d8._0_4_;
                  uVar37 = local_d8._4_4_;
                  if (sVar12 != 0) {
                    pdVar33 = (local_120->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    memmove(pdVar33 + lVar18,pdVar33 + lVar23,sVar12);
                    uVar36 = local_d8._0_4_;
                    uVar37 = local_d8._4_4_;
                  }
                }
                pHVar30 = local_1a0;
                piVar19 = local_188;
                pdVar33 = local_168;
                if ((int)local_138 != 0) {
                  piVar24 = (local_1a0->mwz_column_index).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pcVar5 = (local_1a0->mwz_column_mark).
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pdVar25 = (local_1a0->mwz_column_array).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar13 = (local_1a0->mc_start).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  piVar6 = (local_1a0->mc_count_a).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  piVar7 = (local_1a0->mc_index).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar8 = (local_1a0->mc_value).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pdVar29 = (pointer)0x0;
                  do {
                    iVar17 = piVar24[(long)pdVar29];
                    if (pcVar5[iVar17] != '\0') {
                      dVar41 = pdVar25[iVar17];
                      iVar21 = piVar13[(long)local_188];
                      iVar2 = piVar6[(long)local_188];
                      piVar6[(long)local_188] = iVar2 + 1;
                      lVar18 = (long)iVar21 + (long)iVar2;
                      piVar7[lVar18] = iVar17;
                      pdVar8[lVar18] = dVar41 * -(double)CONCAT44(uVar37,uVar36);
                    }
                    pdVar29 = (pointer)((long)pdVar29 + 1);
                  } while (local_168 != pdVar29);
                  pdVar25 = (pointer)0x0;
                  do {
                    iVar17 = (pHVar30->mwz_column_index).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)pdVar25];
                    if ((pHVar30->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar17] != '\0') {
                      piVar24 = (pHVar30->mr_space).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      iVar21 = (pHVar30->mr_count).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar17];
                      if (iVar21 == piVar24[iVar17]) {
                        piVar13 = (pHVar30->mr_start).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        iVar2 = piVar13[iVar17];
                        uVar31 = (long)(pHVar30->mr_index).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(pHVar30->mr_index).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start;
                        iVar14 = (int)(uVar31 >> 2);
                        piVar13[iVar17] = iVar14;
                        iVar32 = piVar24[iVar17];
                        piVar24[iVar17] = iVar32 * 2;
                        std::vector<int,_std::allocator<int>_>::resize
                                  (local_a0,(long)iVar14 + (long)iVar32 * 2);
                        sVar12 = (long)iVar21 * 4;
                        pHVar30 = local_1a0;
                        if (sVar12 != 0) {
                          piVar24 = (local_a0->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start;
                          memmove((void *)(((long)(uVar31 * 0x40000000) >> 0x1e) + (long)piVar24),
                                  piVar24 + iVar2,sVar12);
                          pHVar30 = local_1a0;
                        }
                      }
                      piVar24 = (pHVar30->mr_count).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      iVar21 = (pHVar30->mr_start).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar17];
                      iVar2 = piVar24[iVar17];
                      piVar24[iVar17] = iVar2 + 1;
                      (pHVar30->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar21 + (long)iVar2] = iVar10;
                      piVar19 = local_188;
                      pdVar33 = local_168;
                    }
                    pdVar25 = (pointer)((long)pdVar25 + 1);
                  } while (pdVar33 != pdVar25);
                  goto LAB_00372c42;
                }
              }
              piVar24 = local_138;
              colFixMax(pHVar30,iVar10);
              piVar13 = (local_1a0->mc_count_a).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if ((int)local_f0 != piVar13[(long)piVar19]) {
                piVar6 = (local_1a0->col_link_last).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                iVar17 = piVar6[(long)piVar19];
                lVar18 = (long)iVar17;
                piVar7 = (local_1a0->col_link_next).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                iVar21 = piVar7[(long)piVar19];
                piVar16 = piVar7 + lVar18;
                if (lVar18 < 0) {
                  piVar16 = (local_1a0->col_link_first).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + (-2 - lVar18);
                }
                *piVar16 = iVar21;
                if (-1 < (long)iVar21) {
                  piVar6[iVar21] = iVar17;
                }
                iVar17 = piVar13[(long)piVar19];
                piVar13 = (local_1a0->col_link_first).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                iVar21 = piVar13[iVar17];
                piVar6[(long)piVar19] = -2 - iVar17;
                piVar7[(long)piVar19] = iVar21;
                piVar13[iVar17] = iVar10;
                if (-1 < (long)iVar21) {
                  piVar6[iVar21] = iVar10;
                }
              }
              dVar39 = (double)((int)local_178 * 2) + local_180 + local_148;
              lVar23 = local_130 + 1;
              this = local_1a0;
              dVar41 = local_198;
              local_180 = dVar39;
            } while (lVar23 < (long)local_f8);
          }
          if ((int)piVar24 != 0) {
            pdVar25 = (pointer)0x0;
            do {
              (this->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start
              [(this->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pdVar25]] = '\0';
              pdVar25 = (pointer)((long)pdVar25 + 1);
            } while (pdVar33 != pdVar25);
          }
          local_150 = (double)local_154 + local_150 + (double)(local_dc * 2);
          bVar35 = false;
          local_180 = dVar39;
          if (0 < (int)local_60) {
            piVar24 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar13 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar19 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar6 = (this->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar7 = (this->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar9 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar18 = local_a8;
            do {
              iVar10 = piVar24[lVar18];
              if (piVar19[iVar10] != piVar13[iVar10]) {
                iVar17 = piVar6[iVar10];
                lVar23 = (long)iVar17;
                iVar21 = piVar7[iVar10];
                piVar16 = piVar7 + lVar23;
                if (lVar23 < 0) {
                  piVar16 = piVar9 + (-2 - lVar23);
                }
                *piVar16 = iVar21;
                if (-1 < (long)iVar21) {
                  piVar6[iVar21] = iVar17;
                }
                iVar17 = piVar13[iVar10];
                iVar21 = piVar9[iVar17];
                piVar6[iVar10] = -2 - iVar17;
                piVar7[iVar10] = iVar21;
                piVar9[iVar17] = iVar10;
                if (-1 < (long)iVar21) {
                  piVar6[iVar21] = iVar10;
                }
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < (int)local_140);
            bVar35 = false;
            this = local_1a0;
          }
        }
        else {
          highsLogDev(local_b8,kWarning,"Defer singular pivot = %11.4g\n");
          if ((local_1a0->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_1a4] == 0) {
            piVar24 = (local_1a0->col_link_first).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            iVar10 = (local_1a0->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar32];
            lVar18 = (long)iVar10;
            uVar27 = piVar24[lVar18];
            piVar13 = (local_1a0->col_link_last).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            piVar13[iVar32] = -2 - iVar10;
            (local_1a0->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar32] = uVar27;
          }
          else {
            zeroCol(local_1a0,iVar32);
            lVar23 = (long)local_1a4;
            piVar24 = (local_1a0->row_link_first).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            iVar10 = (local_1a0->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar23];
            lVar18 = (long)iVar10;
            uVar27 = piVar24[lVar18];
            piVar13 = (local_1a0->row_link_last).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            piVar13[lVar23] = -2 - iVar10;
            (local_1a0->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar23] = uVar27;
            iVar32 = local_1a4;
          }
          piVar24[lVar18] = iVar32;
          if (-1 < (int)uVar27) {
            piVar13[uVar27] = iVar32;
          }
          local_1a0->nwork = local_1a0->nwork + 1;
          bVar35 = false;
          this = local_1a0;
          dVar41 = local_198;
        }
      }
      if (bVar35) {
        return local_170;
      }
      local_16c = local_16c + 1;
      uVar27 = this->nwork;
      sVar12 = (size_t)uVar27;
      iVar10 = uVar27 - 1;
      this->nwork = iVar10;
    } while (0 < (int)uVar27);
    local_150 = local_150 * 160.0;
  }
  this->build_synthetic_tick =
       local_180 * 80.0 + dVar41 * 20.0 + local_150 + this->build_synthetic_tick;
  this->rank_deficiency = 0;
  return 0;
}

Assistant:

HighsInt HFactor::buildKernel() {
  // Deal with the kernel part by 'n-work' pivoting

  double fake_search = 0;
  double fake_fill = 0;
  double fake_eliminate = 0;

  const bool progress_report = false;  // num_basic != num_row;
  const HighsInt progress_frequency = 10000;
  // Initial timer frequency: may be reduced if iterations get slow
  HighsInt timer_frequency = 100;
  double previous_iteration_time = 0;
  double average_iteration_time = 0;
  const bool check_for_timeout = this->time_limit_ < kHighsInf;
  HighsInt search_k = 0;

  const HighsInt check_nwork = -11;
  while (nwork-- > 0) {
    //    printf("\nnwork = %d\n", (int)nwork);
    if (nwork == check_nwork) {
      reportAsm();
    }
    // Determine whether to return due to exceeding the time limit
    if (check_for_timeout && search_k % timer_frequency == 0) {
      double current_time = build_timer_->read();
      double time_difference = current_time - previous_iteration_time;
      previous_iteration_time = current_time;
      double iteration_time = time_difference / (1.0 * timer_frequency);
      average_iteration_time =
          0.9 * average_iteration_time + 0.1 * iteration_time;

      if (time_difference > this->time_limit_ / 1e3)
        timer_frequency = std::max(HighsInt(1), timer_frequency / 10);
      HighsInt iterations_left = kernel_dim - search_k + 1;
      double remaining_time_bound = average_iteration_time * iterations_left;
      double total_time_bound = current_time + remaining_time_bound;
      if (current_time > this->time_limit_ ||
          total_time_bound > this->time_limit_)
        return kBuildKernelReturnTimeout;
    }

    /**
     * 1. Search for the pivot
     */
    HighsInt jColPivot = -1;
    HighsInt iRowPivot = -1;
    //    int8_t pivot_type = kPivotIllegal;
    // 1.1. Setup search merits
    HighsInt searchLimit = min(nwork, HighsInt{8});
    HighsInt searchCount = 0;

    double merit_limit = 1.0 * num_basic * num_row;
    double merit_pivot = merit_limit;

    if (progress_report && search_k) {
      if (search_k % progress_frequency == 0) {
        HighsInt min_col_count = kHighsIInf;
        HighsInt min_row_count = kHighsIInf;
        for (HighsInt count = 1; count < num_row; count++) {
          if (col_link_first[count] >= 0) {
            min_col_count = count;
            break;
          }
        }
        for (HighsInt count = 1; count < num_basic; count++) {
          if (row_link_first[count] >= 0) {
            min_row_count = count;
            break;
          }
        }
        printf(
            "HFactor::buildKernel stage = %6d: min_col_count = %3d; "
            "min_row_count = %3d\n",
            (int)search_k, (int)min_col_count, (int)min_row_count);
      }
    }
    search_k++;
    // 1.2. Search for local singletons
    bool foundPivot = false;
    //    jColPivot = col_link_first[1];
    if (!foundPivot && col_link_first[1] != -1) {
      // Not yet found a pivot and there is at least one column
      // singleton
      jColPivot = col_link_first[1];
      iRowPivot = mc_index[mc_start[jColPivot]];
      foundPivot = true;
    }
    if (!foundPivot && row_link_first[1] != -1) {
      iRowPivot = row_link_first[1];
      jColPivot = mr_index[mr_start[iRowPivot]];
      foundPivot = true;
    }
    const bool singleton_pivot = foundPivot;
#ifndef NDEBUG
    double candidate_pivot_value = 0;
#endif
    // 1.3. Major search loop
    //
    // Row count can be more than the number of rows if num_basic >
    // num_row
    const HighsInt max_count = max(num_row, num_basic);
    for (HighsInt count = 2; !foundPivot && count <= max_count; count++) {
      // Column count cannot exceed the number of rows
      if (count <= num_row) {
        // 1.3.1 Search for columns
        for (HighsInt j = col_link_first[count]; j != -1;
             j = col_link_next[j]) {
          double min_pivot = mc_min_pivot[j];
          HighsInt start = mc_start[j];
          HighsInt end = start + mc_count_a[j];
          for (HighsInt k = start; k < end; k++) {
            if (fabs(mc_value[k]) >= min_pivot) {
              HighsInt i = mc_index[k];
              HighsInt row_count = mr_count[i];
              double merit_local = 1.0 * (count - 1) * (row_count - 1);
              if (merit_pivot > merit_local) {
#ifndef NDEBUG
                candidate_pivot_value = fabs(mc_value[k]);
#endif
                merit_pivot = merit_local;
                jColPivot = j;
                iRowPivot = i;
                foundPivot = foundPivot || (row_count < count);
              }
            }
          }

          if (searchCount++ >= searchLimit && merit_pivot < merit_limit)
            foundPivot = true;
          if (foundPivot) break;

          fake_search += count;
        }
      }

      // Row count cannot exceed the number of basic variables
      if (count <= num_basic) {
        // 1.3.2 Search for rows
        for (HighsInt i = row_link_first[count]; i != -1;
             i = row_link_next[i]) {
          HighsInt start = mr_start[i];
          HighsInt end = start + mr_count[i];
          for (HighsInt k = start; k < end; k++) {
            HighsInt j = mr_index[k];
            HighsInt column_count = mc_count_a[j];
            double merit_local = 1.0 * (count - 1) * (column_count - 1);
            if (merit_local < merit_pivot) {
              HighsInt ifind = mc_start[j];
              while (mc_index[ifind] != i) ifind++;
              if (fabs(mc_value[ifind]) >= mc_min_pivot[j]) {
#ifndef NDEBUG
                candidate_pivot_value = fabs(mc_value[ifind]);
#endif
                merit_pivot = merit_local;
                jColPivot = j;
                iRowPivot = i;
                foundPivot = foundPivot || (column_count <= count);
              }
            }
          }
          if (searchCount++ >= searchLimit && merit_pivot < merit_limit)
            foundPivot = true;
          if (foundPivot) break;
        }

        fake_search += count;
      }
    }
    // 1.4. If we found nothing: tell singular
    if (iRowPivot < 0) {
      // To detect the absence of a pivot, it should be sufficient
      // that iRowPivot is (still) -1, but add sanity asserts that
      // jColPivot is (still) -1 and foundPivot is false
      assert(jColPivot < 0);
      assert(!foundPivot);
      rank_deficiency = nwork + 1;
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Factorization identifies rank deficiency of %d\n",
                  (int)rank_deficiency);
      return rank_deficiency;
    }

    /**
     * 2. Elimination other elements by the pivot
     */
#ifndef NDEBUG
    const HighsInt original_pivotal_row_count = mr_count[iRowPivot];
    const HighsInt original_pivotal_col_count = mc_count_a[jColPivot];
#endif
    // 2.1. Delete the pivot
    //
    // Remove the pivot row index from the pivotal column of the
    // col-wise matrix. Also decreases the column count
    double pivot_multiplier = colDelete(jColPivot, iRowPivot);
    // Remove the pivot column index from the pivotal row of the
    // row-wise matrix. Also decreases the row count
    rowDelete(jColPivot, iRowPivot);
    // Remove the pivotal column from the linked list of columns
    // containing it
    clinkDel(jColPivot);
    // Remove the pivotal row from the linked list of rows containing
    // it
    rlinkDel(iRowPivot);
    if (!singleton_pivot)
      assert(candidate_pivot_value == fabs(pivot_multiplier));
    if (fabs(pivot_multiplier) < pivot_tolerance) {
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Defer singular pivot = %11.4g\n", pivot_multiplier);
      // Matrix is singular, but defer return since other valid pivots
      // may exist.
      assert(mr_count[iRowPivot] == original_pivotal_row_count - 1);
      if (mr_count[iRowPivot] == 0) {
        // The pivot corresponds to a singleton row. Entry is zeroed,
        // and do no more since there may be other valid entries in
        // the pivotal column
        //
        // Add the pivotal column to the linked list of columns with
        // its new count
        assert(mc_count_a[jColPivot] == original_pivotal_col_count - 1);
        clinkAdd(jColPivot, mc_count_a[jColPivot]);
      } else {
        // Otherwise, other entries in the pivotal column will be
        // smaller than the pivot, so zero the column
        zeroCol(jColPivot);
        // Add the pivotal row to the linked list of rows with its new
        // count
        assert(mr_count[iRowPivot] == original_pivotal_row_count - 1);
        rlinkAdd(iRowPivot, mr_count[iRowPivot]);
      }
      // No pivot found, so have to increment nwork
      nwork++;
      continue;
    }
    permute[jColPivot] = iRowPivot;
    assert(mc_var[jColPivot] == basic_index[jColPivot]);

    this->refactor_info_.pivot_row.push_back(iRowPivot);
    this->refactor_info_.pivot_var.push_back(basic_index[jColPivot]);
    this->refactor_info_.pivot_type.push_back(kPivotMarkowitz);

    // 2.2. Store active pivot column to L
    HighsInt start_A = mc_start[jColPivot];
    HighsInt end_A = start_A + mc_count_a[jColPivot];
    HighsInt mwz_column_count = 0;
    for (HighsInt k = start_A; k < end_A; k++) {
      const HighsInt iRow = mc_index[k];
      const double value = mc_value[k] / pivot_multiplier;
      mwz_column_index[mwz_column_count++] = iRow;
      mwz_column_array[iRow] = value;
      mwz_column_mark[iRow] = 1;
      l_index.push_back(iRow);
      l_value.push_back(value);
      mr_count_before[iRow] = mr_count[iRow];
      rowDelete(jColPivot, (int)iRow);
    }
    l_start.push_back(l_index.size());
    fake_fill += 2 * mc_count_a[jColPivot];

    // 2.3. Store non active pivot column to U
    HighsInt end_N = start_A + mc_space[jColPivot];
    HighsInt start_N = end_N - mc_count_n[jColPivot];
    for (HighsInt i = start_N; i < end_N; i++) {
      u_index.push_back(mc_index[i]);
      u_value.push_back(mc_value[i]);
    }
    u_pivot_index.push_back(iRowPivot);
    u_pivot_value.push_back(pivot_multiplier);
    u_start.push_back(u_index.size());
    fake_fill += end_N - start_N;

    // 2.4. Loop over pivot row to eliminate other column
    const HighsInt row_start = mr_start[iRowPivot];
    const HighsInt row_end = row_start + mr_count[iRowPivot];
    for (HighsInt row_k = row_start; row_k < row_end; row_k++) {
      // 2.4.1. My pointer
      HighsInt iCol = mr_index[row_k];
      const HighsInt my_count = mc_count_a[iCol];
      const HighsInt my_start = mc_start[iCol];
      const HighsInt my_end = my_start + my_count - 1;
      double my_pivot = colDelete(iCol, iRowPivot);
      colStoreN(iCol, iRowPivot, my_pivot);

      // 2.4.2. Elimination on the overlapping part
      HighsInt nFillin = mwz_column_count;
      HighsInt nCancel = 0;
      for (HighsInt my_k = my_start; my_k < my_end; my_k++) {
        HighsInt iRow = mc_index[my_k];
        double value = mc_value[my_k];
        if (mwz_column_mark[iRow]) {
          mwz_column_mark[iRow] = 0;
          nFillin--;
          value -= my_pivot * mwz_column_array[iRow];
          if (fabs(value) < kHighsTiny) {
            value = 0;
            nCancel++;
          }
          mc_value[my_k] = value;
        }
      }
      fake_eliminate += mwz_column_count;
      fake_eliminate += nFillin * 2;

      // 2.4.3. Remove cancellation gaps
      if (nCancel > 0) {
        HighsInt new_end = my_start;
        for (HighsInt my_k = my_start; my_k < my_end; my_k++) {
          if (mc_value[my_k] != 0) {
            mc_index[new_end] = mc_index[my_k];
            mc_value[new_end++] = mc_value[my_k];
          } else {
            rowDelete(iCol, mc_index[my_k]);
          }
        }
        mc_count_a[iCol] = new_end - my_start;
      }

      // 2.4.4. Insert fill-in
      if (nFillin > 0) {
        // 2.4.4.1 Check column size
        if (mc_count_a[iCol] + mc_count_n[iCol] + nFillin > mc_space[iCol]) {
          // p1&2=active, p3&4=non active, p5=new p1, p7=new p3
          HighsInt p1 = mc_start[iCol];
          HighsInt p2 = p1 + mc_count_a[iCol];
          HighsInt p3 = p1 + mc_space[iCol] - mc_count_n[iCol];
          HighsInt p4 = p1 + mc_space[iCol];
          mc_space[iCol] += max(mc_space[iCol], nFillin);
          HighsInt p5 = mc_start[iCol] = mc_index.size();
          HighsInt p7 = p5 + mc_space[iCol] - mc_count_n[iCol];
          mc_index.resize(p5 + mc_space[iCol]);
          mc_value.resize(p5 + mc_space[iCol]);
          copy(&mc_index[p1], &mc_index[p2], &mc_index[p5]);
          copy(&mc_value[p1], &mc_value[p2], &mc_value[p5]);
          copy(&mc_index[p3], &mc_index[p4], &mc_index[p7]);
          copy(&mc_value[p3], &mc_value[p4], &mc_value[p7]);
        }

        // 2.4.4.2 Fill into column copy
        for (HighsInt i = 0; i < mwz_column_count; i++) {
          HighsInt iRow = mwz_column_index[i];
          if (mwz_column_mark[iRow])
            colInsert(iCol, iRow, -my_pivot * mwz_column_array[iRow]);
        }

        // 2.4.4.3 Fill into the row copy
        for (HighsInt i = 0; i < mwz_column_count; i++) {
          HighsInt iRow = mwz_column_index[i];
          if (mwz_column_mark[iRow]) {
            // Expand row space
            if (mr_count[iRow] == mr_space[iRow]) {
              HighsInt p1 = mr_start[iRow];
              HighsInt p2 = p1 + mr_count[iRow];
              HighsInt p3 = mr_start[iRow] = mr_index.size();
              mr_space[iRow] *= 2;
              mr_index.resize(p3 + mr_space[iRow]);
              copy(&mr_index[p1], &mr_index[p2], &mr_index[p3]);
            }
            rowInsert(iCol, iRow);
          }
        }
      }

      // 2.4.5. Reset pivot column mark
      for (HighsInt i = 0; i < mwz_column_count; i++)
        mwz_column_mark[mwz_column_index[i]] = 1;

      // 2.4.6. Fix max value and link list
      colFixMax(iCol);
      if (my_count != mc_count_a[iCol]) {
        clinkDel(iCol);
        clinkAdd(iCol, mc_count_a[iCol]);
      }
    }

    // 2.5. Clear pivot column buffer
    for (HighsInt i = 0; i < mwz_column_count; i++)
      mwz_column_mark[mwz_column_index[i]] = 0;

    // 2.6. Correct row links for the remain active part
    for (HighsInt i = start_A; i < end_A; i++) {
      HighsInt iRow = mc_index[i];
      if (mr_count_before[iRow] != mr_count[iRow]) {
        rlinkDel(iRow);
        rlinkAdd(iRow, mr_count[iRow]);
      }
    }
  }
  build_synthetic_tick +=
      fake_search * 20 + fake_fill * 160 + fake_eliminate * 80;
  rank_deficiency = 0;
  return rank_deficiency;
}